

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

ParseStatus
duckdb_re2::ParseUnicodeGroup
          (StringPiece *s,ParseFlags parse_flags,CharClassBuilder *cc,RegexpStatus *status)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_pointer pcVar5;
  ParseStatus PVar6;
  char *pcVar7;
  undefined1 *g;
  uint sign;
  Rune c;
  StringPiece local_68;
  StringPiece local_58;
  char *local_48;
  StringPiece local_40;
  
  if ((parse_flags >> 10 & 1) == 0) {
    return kParseNothing;
  }
  if (s->size_ < 2) {
    return kParseNothing;
  }
  pcVar7 = s->data_;
  if (*pcVar7 != '\\') {
    return kParseNothing;
  }
  bVar1 = pcVar7[1];
  c = (Rune)(char)bVar1;
  if ((bVar1 & 0xdf) != 0x50) {
    return kParseNothing;
  }
  local_58.data_ = s->data_;
  local_58.size_ = s->size_;
  local_68.data_ = (const_pointer)0x0;
  local_68.size_ = 0;
  s->data_ = pcVar7 + 2;
  s->size_ = s->size_ - 2;
  iVar3 = StringPieceToRune(&c,s,status);
  PVar6 = kParseError;
  if (iVar3 == 0) {
    return kParseError;
  }
  if (c == 0x7b) {
    sVar4 = StringPiece::find(s,'}',0);
    if (sVar4 != 0xffffffffffffffff) {
      local_68.data_ = s->data_;
      s->data_ = local_68.data_ + sVar4 + 1;
      s->size_ = s->size_ - (sVar4 + 1);
      local_68.size_ = sVar4;
      local_48 = local_68.data_;
      bVar2 = IsValidUTF8(&local_68,status);
      if (!bVar2) {
        return kParseError;
      }
      pcVar5 = s->data_;
      pcVar7 = local_48;
      goto LAB_00ead968;
    }
    bVar2 = IsValidUTF8(&local_58,status);
    if (!bVar2) {
      return kParseError;
    }
LAB_00eada15:
    status->code_ = kRegexpBadCharRange;
    (status->error_arg_).data_ = local_58.data_;
    (status->error_arg_).size_ = local_58.size_;
  }
  else {
    pcVar7 = local_58.data_ + 2;
    pcVar5 = s->data_;
    sVar4 = (long)pcVar5 - (long)pcVar7;
    local_68.data_ = pcVar7;
    local_68.size_ = sVar4;
LAB_00ead968:
    local_58.size_ = (long)pcVar5 - (long)local_58.data_;
    sign = (uint)(bVar1 != 0x50) * 2 - 1;
    if ((sVar4 != 0) && (*pcVar7 == '^')) {
      sign = -(uint)(bVar1 != 0x50) | 1;
      local_68.data_ = pcVar7 + 1;
      local_68.size_ = sVar4 - 1;
    }
    local_40.data_ = "Any";
    local_40.size_ = 3;
    bVar2 = operator==(&local_68,&local_40);
    if (bVar2) {
      g = anygroup;
    }
    else {
      g = (undefined1 *)LookupGroup(&local_68,(UGroup *)unicode_groups,199);
      if ((UGroup *)g == (UGroup *)0x0) goto LAB_00eada15;
    }
    AddUGroup(cc,(UGroup *)g,sign,parse_flags);
    PVar6 = kParseOk;
  }
  return PVar6;
}

Assistant:

ParseStatus ParseUnicodeGroup(StringPiece* s, Regexp::ParseFlags parse_flags,
                              CharClassBuilder *cc,
                              RegexpStatus* status) {
  // Decide whether to parse.
  if (!(parse_flags & Regexp::UnicodeGroups))
    return kParseNothing;
  if (s->size() < 2 || (*s)[0] != '\\')
    return kParseNothing;
  Rune c = (*s)[1];
  if (c != 'p' && c != 'P')
    return kParseNothing;

  // Committed to parse.  Results:
  int sign = +1;  // -1 = negated char class
  if (c == 'P')
    sign = -sign;
  StringPiece seq = *s;  // \p{Han} or \pL
  StringPiece name;  // Han or L
  s->remove_prefix(2);  // '\\', 'p'

  if (!StringPieceToRune(&c, s, status))
    return kParseError;
  if (c != '{') {
    // Name is the bit of string we just skipped over for c.
    const char* p = seq.data() + 2;
    name = StringPiece(p, static_cast<size_t>(s->data() - p));
  } else {
    // Name is in braces. Look for closing }
    size_t end = s->find('}', 0);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(seq, status))
        return kParseError;
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(seq);
      return kParseError;
    }
    name = StringPiece(s->data(), end);  // without '}'
    s->remove_prefix(end + 1);  // with '}'
    if (!IsValidUTF8(name, status))
      return kParseError;
  }

  // Chop seq where s now begins.
  seq = StringPiece(seq.data(), static_cast<size_t>(s->data() - seq.data()));

  if (!name.empty() && name[0] == '^') {
    sign = -sign;
    name.remove_prefix(1);  // '^'
  }

#if !defined(RE2_USE_ICU)
  // Look up the group in the RE2 Unicode data.
  const UGroup *g = LookupUnicodeGroup(name);
  if (g == NULL) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  AddUGroup(cc, g, sign, parse_flags);
#else
  // Look up the group in the ICU Unicode data. Because ICU provides full
  // Unicode properties support, this could be more than a lookup by name.
  ::icu::UnicodeString ustr = ::icu::UnicodeString::fromUTF8(
      std::string("\\p{") + std::string(name) + std::string("}"));
  UErrorCode uerr = U_ZERO_ERROR;
  ::icu::UnicodeSet uset(ustr, uerr);
  if (U_FAILURE(uerr)) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  // Convert the UnicodeSet to a URange32 and UGroup that we can add.
  int nr = uset.getRangeCount();
  PODArray<URange32> r(nr);
  for (int i = 0; i < nr; i++) {
    r[i].lo = uset.getRangeStart(i);
    r[i].hi = uset.getRangeEnd(i);
  }
  UGroup g = {"", +1, 0, 0, r.data(), nr};
  AddUGroup(cc, &g, sign, parse_flags);
#endif

  return kParseOk;
}